

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.hpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::
statement<char_const(&)[9],char_const*&,char_const(&)[2],char_const*&,char_const(&)[9],char_const(&)[9],char_const*&,char_const(&)[13],char_const*&,char_const(&)[4]>
          (CompilerGLSL *this,char (*ts) [9],char **ts_1,char (*ts_2) [2],char **ts_3,
          char (*ts_4) [9],char (*ts_5) [9],char **ts_6,char (*ts_7) [13],char **ts_8,
          char (*ts_9) [4])

{
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *this_00;
  bool bVar1;
  uint32_t i;
  uint uVar2;
  char (*ts_9_00) [4];
  string local_50;
  
  ts_9_00 = (char (*) [4])0x2bbb99;
  bVar1 = Compiler::is_forcing_recompilation(&this->super_Compiler);
  if (!bVar1) {
    this_00 = this->redirect_statement;
    if (this_00 ==
        (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
         *)0x0) {
      for (uVar2 = 0; uVar2 < this->indent; uVar2 = uVar2 + 1) {
        StringStream<4096UL,_4096UL>::operator<<(&this->buffer,"    ");
      }
      statement_inner<char_const(&)[9],char_const*&,char_const(&)[2],char_const*&,char_const(&)[9],char_const(&)[9],char_const*&,char_const(&)[13],char_const*&,char_const(&)[4]>
                (this,ts,ts_1,ts_2,ts_3,ts_4,ts_5,ts_6,ts_7,ts_8,ts_9);
      StringStream<4096UL,_4096UL>::operator<<(&this->buffer,'\n');
      return;
    }
    join<char_const(&)[9],char_const*&,char_const(&)[2],char_const*&,char_const(&)[9],char_const(&)[9],char_const*&,char_const(&)[13],char_const*&,char_const(&)[4]>
              (&local_50,(spirv_cross *)ts,(char (*) [9])ts_1,(char **)ts_2,(char (*) [2])ts_3,
               (char **)ts_4,ts_5,(char (*) [9])ts_6,(char **)ts_7,(char (*) [13])ts_8,(char **)ts_9
               ,ts_9_00);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(this_00,&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  this->statement_count = this->statement_count + 1;
  return;
}

Assistant:

inline void statement(Ts &&... ts)
	{
		if (is_forcing_recompilation())
		{
			// Do not bother emitting code while force_recompile is active.
			// We will compile again.
			statement_count++;
			return;
		}

		if (redirect_statement)
		{
			redirect_statement->push_back(join(std::forward<Ts>(ts)...));
			statement_count++;
		}
		else
		{
			for (uint32_t i = 0; i < indent; i++)
				buffer << "    ";
			statement_inner(std::forward<Ts>(ts)...);
			buffer << '\n';
		}
	}